

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QCss::PageRule>::emplace<QCss::PageRule_const&>
          (QMovableArrayOps<QCss::PageRule> *this,qsizetype i,PageRule *args)

{
  qsizetype *pqVar1;
  PageRule **ppPVar2;
  PageRule *pPVar3;
  Data *pDVar4;
  PageRule *pPVar5;
  Data *pDVar6;
  char16_t *pcVar7;
  qsizetype qVar8;
  Data *pDVar9;
  long in_FS_OFFSET;
  bool bVar10;
  QArrayDataPointer<QCss::Declaration> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_005eaa2b:
    pDVar6 = (args->selector).d.d;
    pcVar7 = (args->selector).d.ptr;
    qVar8 = (args->selector).d.size;
    if (pDVar6 != (Data *)0x0) {
      LOCK();
      (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
      UNLOCK();
    }
    local_48.d = (args->declarations).d.d;
    local_48.ptr = (args->declarations).d.ptr;
    local_48.size = (args->declarations).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar10 = (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.
             size != 0;
    QArrayDataPointer<QCss::PageRule>::detachAndGrow
              ((QArrayDataPointer<QCss::PageRule> *)this,(uint)(i == 0 && bVar10),1,(PageRule **)0x0
               ,(QArrayDataPointer<QCss::PageRule> *)0x0);
    pPVar5 = (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.
             ptr;
    if (i == 0 && bVar10) {
      pPVar5[-1].selector.d.d = pDVar6;
      pPVar5[-1].selector.d.ptr = pcVar7;
      pPVar5[-1].selector.d.size = qVar8;
      pPVar5[-1].declarations.d.d = local_48.d;
      pPVar5[-1].declarations.d.ptr = local_48.ptr;
      pPVar5[-1].declarations.d.size = local_48.size;
      (this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.ptr =
           pPVar5 + -1;
    }
    else {
      pPVar3 = pPVar5 + i;
      memmove(pPVar3 + 1,pPVar5 + i,
              ((this->super_QGenericArrayOps<QCss::PageRule>).
               super_QArrayDataPointer<QCss::PageRule>.size - i) * 0x30);
      (pPVar3->selector).d.d = pDVar6;
      (pPVar3->selector).d.ptr = pcVar7;
      (pPVar3->selector).d.size = qVar8;
      (pPVar3->declarations).d.d = local_48.d;
      (pPVar3->declarations).d.ptr = local_48.ptr;
      (pPVar3->declarations).d.size = local_48.size;
    }
    local_48.size = 0;
    local_48.ptr = (Declaration *)0x0;
    local_48.d = (Data *)0x0;
    pqVar1 = &(this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>
              .size;
    *pqVar1 = *pqVar1 + 1;
    QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&local_48);
  }
  else {
    if (((this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>.size
         == i) &&
       (pPVar5 = (this->super_QGenericArrayOps<QCss::PageRule>).
                 super_QArrayDataPointer<QCss::PageRule>.ptr,
       (pDVar4->super_QArrayData).alloc - i !=
       ((long)((long)pPVar5 -
              ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 4) *
       -0x5555555555555555)) {
      pDVar6 = (args->selector).d.d;
      pPVar5[i].selector.d.d = pDVar6;
      pPVar5[i].selector.d.ptr = (args->selector).d.ptr;
      pPVar5[i].selector.d.size = (args->selector).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->declarations).d.d;
      pPVar5[i].declarations.d.d = pDVar9;
      pPVar5[i].declarations.d.ptr = (args->declarations).d.ptr;
      pPVar5[i].declarations.d.size = (args->declarations).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      if ((i != 0) ||
         (pPVar5 = (this->super_QGenericArrayOps<QCss::PageRule>).
                   super_QArrayDataPointer<QCss::PageRule>.ptr,
         (PageRule *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
         pPVar5)) goto LAB_005eaa2b;
      pDVar6 = (args->selector).d.d;
      pPVar5[-1].selector.d.d = pDVar6;
      pPVar5[-1].selector.d.ptr = (args->selector).d.ptr;
      pPVar5[-1].selector.d.size = (args->selector).d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pDVar9 = (args->declarations).d.d;
      pPVar5[-1].declarations.d.d = pDVar9;
      pPVar5[-1].declarations.d.ptr = (args->declarations).d.ptr;
      pPVar5[-1].declarations.d.size = (args->declarations).d.size;
      if (pDVar9 != (Data *)0x0) {
        LOCK();
        (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ppPVar2 = &(this->super_QGenericArrayOps<QCss::PageRule>).
                 super_QArrayDataPointer<QCss::PageRule>.ptr;
      *ppPVar2 = *ppPVar2 + -1;
    }
    pqVar1 = &(this->super_QGenericArrayOps<QCss::PageRule>).super_QArrayDataPointer<QCss::PageRule>
              .size;
    *pqVar1 = *pqVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }